

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nonblocking_notifier.hpp
# Opt level: O3

void __thiscall tf::NonblockingNotifierV2::_park(NonblockingNotifierV2 *this,Waiter *w)

{
  unique_lock<std::mutex> lock;
  unique_lock<std::mutex> local_28;
  
  local_28._M_device = &w->mu;
  local_28._M_owns = false;
  std::unique_lock<std::mutex>::lock(&local_28);
  local_28._M_owns = true;
  if (w->state != 2) {
    do {
      w->state = 1;
      std::condition_variable::wait((unique_lock *)&w->cv);
    } while (w->state != 2);
  }
  std::unique_lock<std::mutex>::~unique_lock(&local_28);
  return;
}

Assistant:

void _park(Waiter* w) {
#if __cplusplus >= TF_CPP20
    unsigned target = Waiter::kNotSignaled;
    if(w->state.compare_exchange_strong(target, Waiter::kWaiting,
                                        std::memory_order_relaxed,
                                        std::memory_order_relaxed)) {
      w->state.wait(Waiter::kWaiting, std::memory_order_relaxed);
    }
#else
    std::unique_lock<std::mutex> lock(w->mu);
    while (w->state != Waiter::kSignaled) {
      w->state = Waiter::kWaiting;
      w->cv.wait(lock);
    }
#endif
  }